

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conflict_manager.cpp
# Opt level: O1

Vector * __thiscall duckdb::ConflictManager::InternalIntermediate(ConflictManager *this)

{
  unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true> *this_00;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> __ptr_00;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> _Var1;
  _Head_base<0UL,_duckdb::Vector_*,_false> this_01;
  type pVVar2;
  pointer *__ptr;
  _Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_> local_38;
  LogicalType local_30;
  
  this_00 = &this->intermediate_vector;
  if ((this->intermediate_vector).
      super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
      super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
      super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl == (Vector *)0x0) {
    this_01._M_head_impl = (Vector *)operator_new(0x68);
    LogicalType::LogicalType(&local_30,BOOLEAN);
    Vector::Vector(this_01._M_head_impl,&local_30,true,true,this->input_size);
    local_38.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)
         (_Head_base<0UL,_duckdb::Vector_*,_false>)this_01._M_head_impl;
    LogicalType::~LogicalType(&local_30);
    _Var1.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         local_38.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    local_38.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (_Head_base<0UL,_duckdb::Vector_*,_false>)(Vector *)0x0;
    __ptr_00.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl =
         (this_00->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
         super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
         super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
         super__Head_base<0UL,_duckdb::Vector_*,_false>;
    (this_00->super_unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>_>)._M_t.
    super___uniq_ptr_impl<duckdb::Vector,_std::default_delete<duckdb::Vector>_>._M_t.
    super__Tuple_impl<0UL,_duckdb::Vector_*,_std::default_delete<duckdb::Vector>_>.
    super__Head_base<0UL,_duckdb::Vector_*,_false> =
         _Var1.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl;
    if (__ptr_00.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)this_00,
                 (Vector *)__ptr_00.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
    if (local_38.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl != (Vector *)0x0) {
      ::std::default_delete<duckdb::Vector>::operator()
                ((default_delete<duckdb::Vector> *)&local_38,
                 (Vector *)local_38.super__Head_base<0UL,_duckdb::Vector_*,_false>._M_head_impl);
    }
  }
  pVVar2 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::operator*(this_00)
  ;
  return pVVar2;
}

Assistant:

Vector &ConflictManager::InternalIntermediate() {
	if (!intermediate_vector) {
		intermediate_vector = make_uniq<Vector>(LogicalType::BOOLEAN, true, true, input_size);
	}
	return *intermediate_vector;
}